

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
fixRightImbalance(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  *this,BSTNode **t)

{
  int iVar1;
  BSTNode *pBVar2;
  int oldBF;
  BSTNode *child;
  BSTNode **t_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_local;
  
  pBVar2 = (*t)->right;
  if (pBVar2->bf == -1) {
    iVar1 = pBVar2->left->bf;
    rotateRight(this,&(*t)->right);
    rotateLeft(this,t);
    (*t)->bf = 0;
    if (iVar1 == -1) {
      (*t)->left->bf = 0;
      (*t)->right->bf = 1;
    }
    else if (iVar1 == 0) {
      (*t)->right->bf = 0;
      (*t)->left->bf = 0;
    }
    else if (iVar1 == 1) {
      (*t)->left->bf = -1;
      (*t)->right->bf = 0;
    }
  }
  else if (pBVar2->bf == 0) {
    rotateLeft(this,t);
    (*t)->bf = -1;
    (*t)->left->bf = 1;
  }
  else {
    rotateLeft(this,t);
    (*t)->bf = 0;
    (*t)->left->bf = 0;
  }
  return;
}

Assistant:

void fixRightImbalance(BSTNode * & t) {
      BSTNode *child = t->right;
      if (child->bf == BST_LEFT_HEAVY) {
         int oldBF = child->left->bf;
         rotateRight(t->right);
         rotateLeft(t);
         t->bf = BST_IN_BALANCE;
         switch (oldBF) {
          case BST_LEFT_HEAVY:
            t->left->bf = BST_IN_BALANCE;
            t->right->bf = BST_RIGHT_HEAVY;
            break;
          case BST_IN_BALANCE:
            t->left->bf = t->right->bf = BST_IN_BALANCE;
            break;
          case BST_RIGHT_HEAVY:
            t->left->bf = BST_LEFT_HEAVY;
            t->right->bf = BST_IN_BALANCE;
            break;
         }
      } else if (child->bf == BST_IN_BALANCE) {
         rotateLeft(t);
         t->bf = BST_LEFT_HEAVY;
         t->left->bf = BST_RIGHT_HEAVY;
      } else {
         rotateLeft(t);
         t->left->bf = t->bf = BST_IN_BALANCE;
      }
   }